

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

RPCHelpMan * wallet::listwallets(void)

{
  string m_key_name;
  string m_key_name_00;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  RPCMethodImpl fun;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  undefined8 in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  _Manager_type in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffc88;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcc8 [24];
  pointer in_stack_fffffffffffffce0;
  _Any_data in_stack_fffffffffffffce8;
  pointer pRVar4;
  pointer pRVar5;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  char *local_200;
  size_type local_1f8;
  char local_1f0 [8];
  undefined8 uStack_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  RPCResult local_1a0;
  string local_118 [32];
  string local_f8 [32];
  RPCResult local_d8;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_30,"listwallets",&local_2e1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,
             "Returns a list of currently loaded wallets.\nFor full information on the wallet, use \"getwalletinfo\"\n"
             ,&local_2e2);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"",(allocator<char> *)&stack0xfffffffffffffcdf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"",(allocator<char> *)&stack0xfffffffffffffcde);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c0,"walletname",(allocator<char> *)&stack0xfffffffffffffcbf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"the wallet name",(allocator<char> *)&stack0xfffffffffffffcbe);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffc60;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc58;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffc68;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffc70;
  description._M_string_length = in_stack_fffffffffffffc80;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc78;
  description.field_2 = in_stack_fffffffffffffc88;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_1a0,STR,m_key_name,description,inner,SUB81(local_1c0,0));
  __l._M_len = 1;
  __l._M_array = &local_1a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffcc0,__l,
             (allocator_type *)&stack0xfffffffffffffc97);
  m_key_name_00._M_string_length = in_stack_fffffffffffffc60;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc58;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffffc68;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffffc70;
  description_00._M_string_length = in_stack_fffffffffffffc80;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc78;
  description_00.field_2 = in_stack_fffffffffffffc88;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar2;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar1;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar3;
  RPCResult::RPCResult(&local_d8,ARR,m_key_name_00,description_00,inner_00,SUB81(local_f8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc60;
  result._0_8_ = in_stack_fffffffffffffc58;
  result.m_key_name._M_string_length = in_stack_fffffffffffffc68;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffc70;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffc78;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc80;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffc88;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffffcb0;
  result.m_cond._M_string_length = in_stack_fffffffffffffcc8._0_8_;
  result.m_cond.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffcc8._8_16_;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffce0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"listwallets",(allocator<char> *)&stack0xfffffffffffffc96);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"",(allocator<char> *)&stack0xfffffffffffffc95);
  HelpExampleCli(&local_240,&local_260,&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"listwallets",(allocator<char> *)&stack0xfffffffffffffc94);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"",(allocator<char> *)&stack0xfffffffffffffc93);
  HelpExampleRpc(&local_2a0,&local_2c0,&local_2e0);
  std::operator+(&local_220,&local_240,&local_2a0);
  local_200 = local_1f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p == &local_220.field_2) {
    uStack_1e8 = local_220.field_2._8_8_;
  }
  else {
    local_200 = local_220._M_dataplus._M_p;
  }
  local_1f8 = local_220._M_string_length;
  local_220._M_string_length = 0;
  local_220.field_2._M_local_buf[0] = '\0';
  description_01._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:201:9)>
       ::_M_invoke;
  description_01._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:201:9)>
                ::_M_manager;
  description_01.field_2 = in_stack_fffffffffffffc88;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffce0;
  examples.m_examples._0_24_ = in_stack_fffffffffffffcc8;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar4;
  fun.super__Function_base._M_functor = in_stack_fffffffffffffce8;
  fun._M_invoker = (_Invoker_type)pRVar5;
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffc60,&stack0xfffffffffffffc68)),
             description_01,args,(RPCResults)in_stack_fffffffffffffcb0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffc68);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffce0);
  RPCResult::~RPCResult(&local_d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffcc0);
  RPCResult::~RPCResult(&local_1a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffc98);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffcf8);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan listwallets()
{
    return RPCHelpMan{"listwallets",
                "Returns a list of currently loaded wallets.\n"
                "For full information on the wallet, use \"getwalletinfo\"\n",
                {},
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::STR, "walletname", "the wallet name"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listwallets", "")
            + HelpExampleRpc("listwallets", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue obj(UniValue::VARR);

    WalletContext& context = EnsureWalletContext(request.context);
    for (const std::shared_ptr<CWallet>& wallet : GetWallets(context)) {
        LOCK(wallet->cs_wallet);
        obj.push_back(wallet->GetName());
    }

    return obj;
},
    };
}